

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O2

Flow __thiscall Dinic::blocking(Dinic *this,int a,Flow val)

{
  uint uVar1;
  int a_00;
  pointer piVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer pEVar5;
  Flow FVar6;
  pointer pEVar7;
  long lVar8;
  int iVar9;
  
  if ((val != 0) && (this->T != a)) {
    piVar2 = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = piVar2[a];
    while( true ) {
      pvVar3 = (this->g).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = *(long *)&pvVar3[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar3[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 8) - lVar8 >> 2) <= (ulong)(long)iVar9)
      break;
      uVar1 = *(uint *)(lVar8 + (long)iVar9 * 4);
      pEVar7 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      a_00 = pEVar7[(int)uVar1].b;
      if (piVar4[a_00] == piVar4[a] + 1) {
        pEVar7 = pEVar7 + (int)uVar1;
        lVar8 = pEVar7->cap - pEVar7->flow;
        if (val <= lVar8) {
          lVar8 = val;
        }
        FVar6 = blocking(this,a_00,lVar8);
        if (FVar6 != 0) {
          pEVar5 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pEVar7 = pEVar5 + (int)uVar1;
          pEVar7->flow = pEVar7->flow + FVar6;
          pEVar5 = pEVar5 + (int)(uVar1 ^ 1);
          pEVar5->flow = pEVar5->flow - FVar6;
          return FVar6;
        }
        iVar9 = piVar2[a];
      }
      iVar9 = iVar9 + 1;
      piVar2[a] = iVar9;
    }
    val = 0;
  }
  return val;
}

Assistant:

Flow blocking(int a, Flow val) {
        if (a == T || val == 0) return val;
        for (int &i = pt[a]; i < g[a].size(); i++) {
            int x = g[a][i];
            int b = e[x].b;
            if (d[b] == d[a] + 1) {
                if (Flow added = blocking(b, min(val, e[x].unused()))) {
                    e[x].flow += added;
                    e[x ^ 1].flow -= added;
                    return added;
                }
            }
        }
        return 0;
    }